

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O1

void __thiscall
SolutionWriterTest_IgnoreFeasibleSolutions_Test::~SolutionWriterTest_IgnoreFeasibleSolutions_Test
          (SolutionWriterTest_IgnoreFeasibleSolutions_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SolutionWriterTest, IgnoreFeasibleSolutions) {
  SolCountingSolver solver(true);
  typedef SolCountingSolver::ProblemBuilder ProblemBuilder;
  ProblemBuilder problem_builder;
  mp::SolutionWriter<SolCountingSolver,
      StrictMock<MockSolWriter<ProblemBuilder> > >
      writer("test", solver, problem_builder);
  writer.HandleFeasibleSolution("", 0, 0, 0);
  EXPECT_CALL(writer.sol_writer(), Write(_, MatchNoNSol()));
  writer.HandleSolution(0, "", 0, 0, 0);
}